

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::_load_cimg
          (CImgList<unsigned_char> *this,FILE *file,char *filename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  CImgArgumentException *pCVar8;
  CImgIOException *pCVar9;
  long lVar10;
  bool *pbVar11;
  bool *pbVar12;
  bool *pbVar13;
  CImg<unsigned_char> *pCVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  char cVar18;
  char cVar19;
  char *pcVar20;
  bool *pbVar21;
  ulong uVar22;
  uchar *puVar23;
  bool bVar24;
  bool bVar25;
  uint C;
  uint D;
  uint H;
  uint W;
  uint N;
  CImg<bool> raw;
  unsigned_long csiz;
  CImg<char> tmp;
  CImg<char> str_pixeltype;
  CImg<char> str_endian;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar8 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (pCVar8,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Specified filename is (null).",
               (ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
    __cxa_throw(pCVar8,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  CImg<char>::CImg(&tmp,0x100,1,1,1);
  CImg<char>::CImg(&str_pixeltype,0x100,1,1,1);
  CImg<char>::CImg(&str_endian,0x100,1,1,1);
  *str_endian._data = '\0';
  *str_pixeltype._data = '\0';
  *tmp._data = '\0';
  N = 0;
  do {
    iVar2 = fgetc(__stream);
    bVar25 = iVar2 >= 0;
    if (iVar2 < 0 || iVar2 == 10) {
      uVar22 = 0;
    }
    else {
      uVar16 = 0;
      do {
        uVar22 = uVar16 + 1;
        tmp._data[uVar16] = (char)iVar2;
        iVar2 = fgetc(__stream);
        bVar25 = -1 < iVar2;
        if ((iVar2 == 10) || (0xfd < uVar16)) break;
        uVar16 = uVar22;
      } while (-1 < iVar2);
    }
    tmp._data[uVar22] = '\0';
  } while ((bVar25) && (*tmp._data == '#'));
  iVar2 = __isoc99_sscanf(tmp._data,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",&N,str_pixeltype._data,
                          str_endian._data);
  if (iVar2 < 2) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar20 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar20 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar9,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): CImg header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
               pcVar20);
    goto LAB_0013ca27;
  }
  lVar10 = 0;
  do {
    cVar1 = "little"[lVar10];
    cVar18 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar18 = cVar1;
    }
    cVar1 = str_endian._data[lVar10];
    cVar19 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar19 = cVar1;
    }
    if (cVar18 != cVar19) {
      if ((int)lVar10 != 6) {
        lVar10 = 0;
        goto LAB_0013b095;
      }
      break;
    }
    lVar10 = lVar10 + 1;
  } while ((int)lVar10 != 6);
LAB_0013b0dc:
  bVar25 = false;
  goto LAB_0013b0df;
  while (lVar10 = lVar10 + 1, (int)lVar10 != 3) {
LAB_0013b095:
    cVar1 = "big"[lVar10];
    cVar18 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar18 = cVar1;
    }
    cVar1 = str_endian._data[lVar10];
    cVar19 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar19 = cVar1;
    }
    if (cVar18 != cVar19) {
      if ((int)lVar10 != 3) goto LAB_0013b0dc;
      break;
    }
  }
  bVar25 = true;
LAB_0013b0df:
  assign(this,N);
  pcVar20 = str_pixeltype._data;
  sVar5 = strlen(str_pixeltype._data);
  iVar3 = (int)sVar5;
  iVar2 = 4;
  if (iVar3 < 4) {
    iVar2 = iVar3;
  }
  if (iVar2 != -1) {
    if (iVar3 < 0) {
      lVar10 = 0;
LAB_0013b179:
      if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
        sVar5 = strlen(pcVar20);
        iVar3 = (int)sVar5;
        iVar2 = 0xd;
        if (iVar3 < 0xd) {
          iVar2 = iVar3;
        }
        if (iVar2 != -1) {
          if (iVar3 < 0) {
            lVar10 = 0;
LAB_0013b535:
            if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
              sVar5 = strlen(pcVar20);
              iVar3 = (int)sVar5;
              iVar2 = 5;
              if (iVar3 < 5) {
                iVar2 = iVar3;
              }
              if (iVar2 != -1) {
                if (iVar3 < 0) {
                  lVar10 = 0;
LAB_0013b823:
                  if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                    sVar5 = strlen(pcVar20);
                    iVar3 = (int)sVar5;
                    iVar2 = 4;
                    if (iVar3 < 4) {
                      iVar2 = iVar3;
                    }
                    if (iVar2 != -1) {
                      if (iVar3 < 0) {
                        lVar10 = 0;
LAB_0013bb10:
                        if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                          sVar5 = strlen(pcVar20);
                          iVar3 = (int)sVar5;
                          iVar2 = 0xe;
                          if (iVar3 < 0xe) {
                            iVar2 = iVar3;
                          }
                          if (iVar2 != -1) {
                            if (iVar3 < 0) {
                              lVar10 = 0;
LAB_0013be67:
                              if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                                sVar5 = strlen(pcVar20);
                                iVar3 = (int)sVar5;
                                iVar2 = 6;
                                if (iVar3 < 6) {
                                  iVar2 = iVar3;
                                }
                                if (iVar2 != -1) {
                                  if (iVar3 < 0) {
                                    lVar10 = 0;
LAB_0013c179:
                                    if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                                      sVar5 = strlen(pcVar20);
                                      iVar3 = (int)sVar5;
                                      iVar2 = 5;
                                      if (iVar3 < 5) {
                                        iVar2 = iVar3;
                                      }
                                      if (iVar2 != -1) {
                                        if (iVar3 < 0) {
                                          lVar10 = 0;
LAB_0013c580:
                                          if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                                            sVar5 = strlen(pcVar20);
                                            iVar3 = (int)sVar5;
                                            iVar2 = 0xc;
                                            if (iVar3 < 0xc) {
                                              iVar2 = iVar3;
                                            }
                                            if (iVar2 != -1) {
                                              if (iVar3 < 0) {
                                                lVar10 = 0;
LAB_0013ca3f:
                                                if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                                                  sVar5 = strlen(pcVar20);
                                                  iVar3 = (int)sVar5;
                                                  iVar2 = 4;
                                                  if (iVar3 < 4) {
                                                    iVar2 = iVar3;
                                                  }
                                                  if (iVar2 != -1) {
                                                    if (iVar3 < 0) {
                                                      lVar10 = 0;
LAB_0013cdf1:
                                                      if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                                                        sVar5 = strlen(pcVar20);
                                                        iVar3 = (int)sVar5;
                                                        iVar2 = 3;
                                                        if (iVar3 < 3) {
                                                          iVar2 = iVar3;
                                                        }
                                                        if (iVar2 != -1) {
                                                          if (iVar3 < 0) {
                                                            lVar10 = 0;
LAB_0013d1ab:
                                                            if ((int)lVar10 != iVar2 + 1 &&
                                                                -1 < iVar3) {
                                                              sVar5 = strlen(pcVar20);
                                                              iVar3 = (int)sVar5;
                                                              iVar2 = 0xd;
                                                              if (iVar3 < 0xd) {
                                                                iVar2 = iVar3;
                                                              }
                                                              if (iVar2 != -1) {
                                                                if (iVar3 < 0) {
                                                                  lVar10 = 0;
LAB_0013d55b:
                                                                  if ((int)lVar10 != iVar2 + 1 &&
                                                                      -1 < iVar3) {
                                                                    sVar5 = strlen(pcVar20);
                                                                    iVar3 = (int)sVar5;
                                                                    iVar2 = 5;
                                                                    if (iVar3 < 5) {
                                                                      iVar2 = iVar3;
                                                                    }
                                                                    if (iVar2 != -1) {
                                                                      if (iVar3 < 0) {
                                                                        lVar10 = 0;
LAB_0013d931:
                                                                        if ((int)lVar10 != iVar2 + 1
                                                                            && -1 < iVar3) {
                                                                          sVar5 = strlen(pcVar20);
                                                                          iVar3 = (int)sVar5;
                                                                          iVar2 = 4;
                                                                          if (iVar3 < 4) {
                                                                            iVar2 = iVar3;
                                                                          }
                                                                          if (iVar2 != -1) {
                                                                            if (iVar3 < 0) {
                                                                              lVar10 = 0;
LAB_0013dd07:
                                                                              if ((int)lVar10 !=
                                                                                  iVar2 + 1 &&
                                                                                  -1 < iVar3) {
                                                                                sVar5 = strlen(
                                                  pcVar20);
                                                  iVar3 = (int)sVar5;
                                                  iVar2 = 5;
                                                  if (iVar3 < 5) {
                                                    iVar2 = iVar3;
                                                  }
                                                  if (iVar2 != -1) {
                                                    if (iVar3 < 0) {
                                                      lVar10 = 0;
LAB_0013e0dd:
                                                      if ((int)lVar10 != iVar2 + 1 && -1 < iVar3) {
                                                        sVar5 = strlen(pcVar20);
                                                        iVar3 = (int)sVar5;
                                                        iVar2 = 6;
                                                        if (iVar3 < 6) {
                                                          iVar2 = iVar3;
                                                        }
                                                        if (iVar2 != -1) {
                                                          if (iVar3 < 0) {
                                                            lVar10 = 0;
LAB_0013e48e:
                                                            if ((int)lVar10 != iVar2 + 1 &&
                                                                -1 < iVar3) {
                                                              if (file == (FILE *)0x0) {
                                                                cimg::fclose(__stream);
                                                              }
                                                              pCVar9 = (CImgIOException *)
                                                                       __cxa_allocate_exception
                                                                                 (0x10);
                                                              pcVar20 = "(FILE*)";
                                                              if (filename != (char *)0x0) {
                                                                pcVar20 = filename;
                                                              }
                                                              CImgIOException::CImgIOException
                                                                        (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unsupported pixel type \'%s\' for file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",str_pixeltype._data,
                                                  pcVar20);
LAB_0013ca27:
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 6;
                                                    if (iVar3 < 6) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "double"[lVar10];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013e48e;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<double>::assign
                                                                ((CImg<double> *)&raw,(uint)uVar7,1,
                                                                 1,1);
                                                      cimg::fread<double>((double *)raw._data,
                                                                          raw._0_8_ & 0xffffffff,
                                                                          (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar11 = raw._data + lVar10 * 8 + -1;
                                                        pbVar12 = raw._data + lVar10 * 8;
                                                        do {
                                                          pbVar13 = pbVar12 + -8;
                                                          lVar10 = -8;
                                                          pbVar21 = pbVar11;
                                                          do {
                                                            bVar24 = pbVar12[lVar10];
                                                            pbVar12[lVar10] = *pbVar21;
                                                            *pbVar21 = bVar24;
                                                            lVar10 = lVar10 + 1;
                                                            pbVar21 = pbVar21 + -1;
                                                          } while ((int)lVar10 != -4);
                                                          pbVar11 = pbVar11 + -8;
                                                          pbVar12 = pbVar13;
                                                        } while (raw._data < pbVar13);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] =
                                                               (uchar)(int)*(double *)
                                                                            (raw._data + uVar15 * 8)
                                                          ;
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 5;
                                                    if (iVar3 < 5) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "float"[lVar10];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013e0dd;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<float>::assign((CImg<float> *)&raw,
                                                                          (uint)uVar7,1,1,1);
                                                      cimg::fread<float>((float *)raw._data,
                                                                         raw._0_8_ & 0xffffffff,
                                                                         (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar12 = raw._data + lVar10 * 4;
                                                        do {
                                                          uVar4 = *(uint *)(pbVar12 + -4);
                                                          *(uint *)(pbVar12 + -4) =
                                                               uVar4 >> 0x18 |
                                                               (uVar4 & 0xff0000) >> 8 |
                                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                                                          ;
                                                          pbVar12 = pbVar12 + -4;
                                                        } while (raw._data < pbVar12);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] =
                                                               (uchar)(int)*(float *)(raw._data +
                                                                                     uVar15 * 4);
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 4;
                                                    if (iVar3 < 4) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "unsigned long"[lVar10 + 9];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013dd07;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<long>::assign((CImg<long> *)&raw,
                                                                         (uint)uVar7,1,1,1);
                                                      cimg::fread<long>((long *)raw._data,
                                                                        raw._0_8_ & 0xffffffff,
                                                                        (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar11 = raw._data + lVar10 * 8 + -1;
                                                        pbVar12 = raw._data + lVar10 * 8;
                                                        do {
                                                          pbVar13 = pbVar12 + -8;
                                                          lVar10 = -8;
                                                          pbVar21 = pbVar11;
                                                          do {
                                                            bVar24 = pbVar12[lVar10];
                                                            pbVar12[lVar10] = *pbVar21;
                                                            *pbVar21 = bVar24;
                                                            lVar10 = lVar10 + 1;
                                                            pbVar21 = pbVar21 + -1;
                                                          } while ((int)lVar10 != -4);
                                                          pbVar11 = pbVar11 + -8;
                                                          pbVar12 = pbVar13;
                                                        } while (raw._data < pbVar13);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] = raw._data[uVar15 * 8];
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 5;
                                                    if (iVar3 < 5) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "ulong"[lVar10];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013d931;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<unsigned_long>::assign
                                                                ((CImg<unsigned_long> *)&raw,
                                                                 (uint)uVar7,1,1,1);
                                                      cimg::fread<unsigned_long>
                                                                ((unsigned_long *)raw._data,
                                                                 raw._0_8_ & 0xffffffff,
                                                                 (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar11 = raw._data + lVar10 * 8 + -1;
                                                        pbVar12 = raw._data + lVar10 * 8;
                                                        do {
                                                          pbVar13 = pbVar12 + -8;
                                                          lVar10 = -8;
                                                          pbVar21 = pbVar11;
                                                          do {
                                                            bVar24 = pbVar12[lVar10];
                                                            pbVar12[lVar10] = *pbVar21;
                                                            *pbVar21 = bVar24;
                                                            lVar10 = lVar10 + 1;
                                                            pbVar21 = pbVar21 + -1;
                                                          } while ((int)lVar10 != -4);
                                                          pbVar11 = pbVar11 + -8;
                                                          pbVar12 = pbVar13;
                                                        } while (raw._data < pbVar13);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] = raw._data[uVar15 * 8];
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 0xd;
                                                    if (iVar3 < 0xd) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "unsigned_long"[lVar10];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013d55b;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<unsigned_long>::assign
                                                                ((CImg<unsigned_long> *)&raw,
                                                                 (uint)uVar7,1,1,1);
                                                      cimg::fread<unsigned_long>
                                                                ((unsigned_long *)raw._data,
                                                                 raw._0_8_ & 0xffffffff,
                                                                 (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar11 = raw._data + lVar10 * 8 + -1;
                                                        pbVar12 = raw._data + lVar10 * 8;
                                                        do {
                                                          pbVar13 = pbVar12 + -8;
                                                          lVar10 = -8;
                                                          pbVar21 = pbVar11;
                                                          do {
                                                            bVar24 = pbVar12[lVar10];
                                                            pbVar12[lVar10] = *pbVar21;
                                                            *pbVar21 = bVar24;
                                                            lVar10 = lVar10 + 1;
                                                            pbVar21 = pbVar21 + -1;
                                                          } while ((int)lVar10 != -4);
                                                          pbVar11 = pbVar11 + -8;
                                                          pbVar12 = pbVar13;
                                                        } while (raw._data < pbVar13);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] = raw._data[uVar15 * 8];
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 3;
                                                    if (iVar3 < 3) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "unsigned int"[lVar10 + 9];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013d1ab;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<int>::assign((CImg<int> *)&raw,
                                                                        (uint)uVar7,1,1,1);
                                                      cimg::fread<int>((int *)raw._data,
                                                                       raw._0_8_ & 0xffffffff,
                                                                       (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar12 = raw._data + lVar10 * 4;
                                                        do {
                                                          uVar4 = *(uint *)(pbVar12 + -4);
                                                          *(uint *)(pbVar12 + -4) =
                                                               uVar4 >> 0x18 |
                                                               (uVar4 & 0xff0000) >> 8 |
                                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                                                          ;
                                                          pbVar12 = pbVar12 + -4;
                                                        } while (raw._data < pbVar12);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] = raw._data[uVar15 * 4];
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                  }
                                                  }
                                                  else {
                                                    iVar17 = 4;
                                                    if (iVar3 < 4) {
                                                      iVar17 = iVar3;
                                                    }
                                                    lVar10 = 0;
                                                    do {
                                                      cVar1 = "uint"[lVar10];
                                                      cVar18 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar18 = cVar1;
                                                      }
                                                      cVar1 = pcVar20[lVar10];
                                                      cVar19 = cVar1 + ' ';
                                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                        cVar19 = cVar1;
                                                      }
                                                      if (cVar18 != cVar19) goto LAB_0013cdf1;
                                                      lVar10 = lVar10 + 1;
                                                    } while (iVar17 + 1 != (int)lVar10);
                                                  }
                                                  }
                                                  if (N != 0) {
                                                    uVar22 = 0;
                                                    do {
                                                      iVar2 = fgetc(__stream);
                                                      if (iVar2 < 0 || iVar2 == 10) {
                                                        uVar16 = 0;
                                                      }
                                                      else {
                                                        uVar7 = 0;
                                                        do {
                                                          uVar16 = uVar7 + 1;
                                                          tmp._data[uVar7] = (char)iVar2;
                                                          iVar2 = fgetc(__stream);
                                                          if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                          bVar24 = uVar7 < 0xfe;
                                                          uVar7 = uVar16;
                                                        } while (bVar24);
                                                      }
                                                      tmp._data[uVar16] = '\0';
                                                      C = 0;
                                                      D = 0;
                                                      H = 0;
                                                      W = 0;
                                                      csiz = 0;
                                                      iVar2 = __isoc99_sscanf(tmp._data,
                                                                              "%u %u %u %u #%lu",&W,
                                                                              &H,&D,&C,&csiz);
                                                      if (iVar2 < 4) {
                                                        pCVar9 = (CImgIOException *)
                                                                 __cxa_allocate_exception(0x10);
                                                        pcVar20 = "(FILE*)";
                                                        if (filename != (char *)0x0) {
                                                          pcVar20 = filename;
                                                        }
                                                        CImgIOException::CImgIOException
                                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  if (D * C * H * W != 0) {
                                                    raw._data = (bool *)0x0;
                                                    raw._width = 0;
                                                    raw._height = 0;
                                                    raw._depth = 0;
                                                    raw._spectrum = 0;
                                                    raw._is_shared = false;
                                                    if (iVar2 == 5) {
                                                      pCVar9 = (CImgIOException *)
                                                               __cxa_allocate_exception(0x10);
                                                      pcVar20 = "(FILE*)";
                                                      if (filename != (char *)0x0) {
                                                        pcVar20 = filename;
                                                      }
                                                      CImgIOException::CImgIOException
                                                                (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<unsigned_int>::assign
                                                                ((CImg<unsigned_int> *)&raw,
                                                                 (uint)uVar7,1,1,1);
                                                      cimg::fread<unsigned_int>
                                                                ((uint *)raw._data,
                                                                 raw._0_8_ & 0xffffffff,
                                                                 (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar12 = raw._data + lVar10 * 4;
                                                        do {
                                                          uVar4 = *(uint *)(pbVar12 + -4);
                                                          *(uint *)(pbVar12 + -4) =
                                                               uVar4 >> 0x18 |
                                                               (uVar4 & 0xff0000) >> 8 |
                                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                                                          ;
                                                          pbVar12 = pbVar12 + -4;
                                                        } while (raw._data < pbVar12);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] = raw._data[uVar15 * 4];
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                  }
                                                  uVar22 = uVar22 + 1;
                                                  } while (uVar22 < N);
                                                  }
                                                  goto LAB_0013b3e8;
                                                }
                                              }
                                              else {
                                                iVar17 = 0xc;
                                                if (iVar3 < 0xc) {
                                                  iVar17 = iVar3;
                                                }
                                                lVar10 = 0;
                                                do {
                                                  cVar1 = "unsigned_int"[lVar10];
                                                  cVar18 = cVar1 + ' ';
                                                  if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                    cVar18 = cVar1;
                                                  }
                                                  cVar1 = pcVar20[lVar10];
                                                  cVar19 = cVar1 + ' ';
                                                  if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                                    cVar19 = cVar1;
                                                  }
                                                  if (cVar18 != cVar19) goto LAB_0013ca3f;
                                                  lVar10 = lVar10 + 1;
                                                } while (iVar17 + 1 != (int)lVar10);
                                              }
                                            }
                                            if (N != 0) {
                                              uVar22 = 0;
                                              do {
                                                iVar2 = fgetc(__stream);
                                                if (iVar2 < 0 || iVar2 == 10) {
                                                  uVar16 = 0;
                                                }
                                                else {
                                                  uVar7 = 0;
                                                  do {
                                                    uVar16 = uVar7 + 1;
                                                    tmp._data[uVar7] = (char)iVar2;
                                                    iVar2 = fgetc(__stream);
                                                    if ((iVar2 == 10) || (iVar2 < 0)) break;
                                                    bVar24 = uVar7 < 0xfe;
                                                    uVar7 = uVar16;
                                                  } while (bVar24);
                                                }
                                                tmp._data[uVar16] = '\0';
                                                C = 0;
                                                D = 0;
                                                H = 0;
                                                W = 0;
                                                csiz = 0;
                                                iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu"
                                                                        ,&W,&H,&D,&C,&csiz);
                                                if (iVar2 < 4) {
                                                  pCVar9 = (CImgIOException *)
                                                           __cxa_allocate_exception(0x10);
                                                  pcVar20 = "(FILE*)";
                                                  if (filename != (char *)0x0) {
                                                    pcVar20 = filename;
                                                  }
                                                  CImgIOException::CImgIOException
                                                            (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                }
                                                if (D * C * H * W != 0) {
                                                  raw._data = (bool *)0x0;
                                                  raw._width = 0;
                                                  raw._height = 0;
                                                  raw._depth = 0;
                                                  raw._spectrum = 0;
                                                  raw._is_shared = false;
                                                  if (iVar2 == 5) {
                                                    pCVar9 = (CImgIOException *)
                                                             __cxa_allocate_exception(0x10);
                                                    pcVar20 = "(FILE*)";
                                                    if (filename != (char *)0x0) {
                                                      pcVar20 = filename;
                                                    }
                                                    CImgIOException::CImgIOException
                                                              (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                              CImgException::~CImgException);
                                                  }
                                                  pCVar14 = this->_data + uVar22;
                                                  CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                                  uVar16 = (ulong)pCVar14->_spectrum *
                                                           (ulong)pCVar14->_depth *
                                                           (ulong)pCVar14->_height *
                                                           (ulong)pCVar14->_width;
                                                  if (uVar16 != 0) {
                                                    puVar23 = pCVar14->_data;
                                                    do {
                                                      uVar7 = 0x1800000;
                                                      if (uVar16 < 0x1800000) {
                                                        uVar7 = uVar16;
                                                      }
                                                      CImg<unsigned_int>::assign
                                                                ((CImg<unsigned_int> *)&raw,
                                                                 (uint)uVar7,1,1,1);
                                                      cimg::fread<unsigned_int>
                                                                ((uint *)raw._data,
                                                                 raw._0_8_ & 0xffffffff,
                                                                 (FILE *)__stream);
                                                      if ((bVar25) &&
                                                         (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                                   (raw._8_8_ & 0xffffffff) *
                                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                                   (raw._0_8_ & 0xffffffff),
                                                         0 < lVar10)) {
                                                        pbVar12 = raw._data + lVar10 * 4;
                                                        do {
                                                          uVar4 = *(uint *)(pbVar12 + -4);
                                                          *(uint *)(pbVar12 + -4) =
                                                               uVar4 >> 0x18 |
                                                               (uVar4 & 0xff0000) >> 8 |
                                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                                                          ;
                                                          pbVar12 = pbVar12 + -4;
                                                        } while (raw._data < pbVar12);
                                                      }
                                                      if (raw._width == 0) {
                                                        uVar7 = 0;
                                                      }
                                                      else {
                                                        uVar15 = 0;
                                                        do {
                                                          puVar23[uVar15] = raw._data[uVar15 * 4];
                                                          uVar15 = uVar15 + 1;
                                                        } while ((raw._0_8_ & 0xffffffff) != uVar15)
                                                        ;
                                                        uVar7 = raw._0_8_ & 0xffffffff;
                                                        puVar23 = puVar23 + uVar15;
                                                      }
                                                      uVar16 = uVar16 - uVar7;
                                                    } while (uVar16 != 0);
                                                  }
                                                  if ((raw._is_shared == false) &&
                                                     (raw._data != (bool *)0x0)) {
                                                    operator_delete__(raw._data);
                                                  }
                                                }
                                                uVar22 = uVar22 + 1;
                                              } while (uVar22 < N);
                                            }
                                            goto LAB_0013b3e8;
                                          }
                                        }
                                        else {
                                          iVar17 = 5;
                                          if (iVar3 < 5) {
                                            iVar17 = iVar3;
                                          }
                                          lVar10 = 0;
                                          do {
                                            cVar1 = "unsigned short"[lVar10 + 9];
                                            cVar18 = cVar1 + ' ';
                                            if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                              cVar18 = cVar1;
                                            }
                                            cVar1 = pcVar20[lVar10];
                                            cVar19 = cVar1 + ' ';
                                            if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                              cVar19 = cVar1;
                                            }
                                            if (cVar18 != cVar19) goto LAB_0013c580;
                                            lVar10 = lVar10 + 1;
                                          } while (iVar17 + 1 != (int)lVar10);
                                        }
                                      }
                                      if (N != 0) {
                                        uVar22 = 0;
                                        do {
                                          iVar2 = fgetc(__stream);
                                          if (iVar2 < 0 || iVar2 == 10) {
                                            uVar16 = 0;
                                          }
                                          else {
                                            uVar7 = 0;
                                            do {
                                              uVar16 = uVar7 + 1;
                                              tmp._data[uVar7] = (char)iVar2;
                                              iVar2 = fgetc(__stream);
                                              if ((iVar2 == 10) || (iVar2 < 0)) break;
                                              bVar24 = uVar7 < 0xfe;
                                              uVar7 = uVar16;
                                            } while (bVar24);
                                          }
                                          tmp._data[uVar16] = '\0';
                                          C = 0;
                                          D = 0;
                                          H = 0;
                                          W = 0;
                                          csiz = 0;
                                          iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H
                                                                  ,&D,&C,&csiz);
                                          if (iVar2 < 4) {
                                            pCVar9 = (CImgIOException *)
                                                     __cxa_allocate_exception(0x10);
                                            pcVar20 = "(FILE*)";
                                            if (filename != (char *)0x0) {
                                              pcVar20 = filename;
                                            }
                                            CImgIOException::CImgIOException
                                                      (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                  (ulong)D,(ulong)C,uVar22,pcVar20);
                                            __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                        CImgException::~CImgException);
                                          }
                                          if (D * C * H * W != 0) {
                                            raw._data = (bool *)0x0;
                                            raw._width = 0;
                                            raw._height = 0;
                                            raw._depth = 0;
                                            raw._spectrum = 0;
                                            raw._is_shared = false;
                                            if (iVar2 == 5) {
                                              pCVar9 = (CImgIOException *)
                                                       __cxa_allocate_exception(0x10);
                                              pcVar20 = "(FILE*)";
                                              if (filename != (char *)0x0) {
                                                pcVar20 = filename;
                                              }
                                              CImgIOException::CImgIOException
                                                        (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                              __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                          CImgException::~CImgException);
                                            }
                                            pCVar14 = this->_data + uVar22;
                                            CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                            uVar16 = (ulong)pCVar14->_spectrum *
                                                     (ulong)pCVar14->_depth *
                                                     (ulong)pCVar14->_height *
                                                     (ulong)pCVar14->_width;
                                            if (uVar16 != 0) {
                                              puVar23 = pCVar14->_data;
                                              do {
                                                uVar7 = 0x1800000;
                                                if (uVar16 < 0x1800000) {
                                                  uVar7 = uVar16;
                                                }
                                                CImg<short>::assign((CImg<short> *)&raw,(uint)uVar7,
                                                                    1,1,1);
                                                cimg::fread<short>((short *)raw._data,
                                                                   raw._0_8_ & 0xffffffff,
                                                                   (FILE *)__stream);
                                                uVar7 = raw._0_8_ & 0xffffffff;
                                                if ((bVar25) &&
                                                   (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                             (raw._8_8_ & 0xffffffff) *
                                                             ((ulong)raw._0_8_ >> 0x20) * uVar7,
                                                   0 < lVar10)) {
                                                  pbVar12 = raw._data + lVar10 * 2;
                                                  do {
                                                    pbVar11 = pbVar12 + -2;
                                                    *(ushort *)pbVar11 =
                                                         *(ushort *)pbVar11 << 8 |
                                                         *(ushort *)pbVar11 >> 8;
                                                    pbVar12 = pbVar12 + -2;
                                                  } while (raw._data < pbVar12);
                                                }
                                                if (uVar7 == 0) {
                                                  uVar7 = 0;
                                                }
                                                else {
                                                  uVar15 = 0;
                                                  do {
                                                    puVar23[uVar15] = raw._data[uVar15 * 2];
                                                    uVar15 = uVar15 + 1;
                                                  } while (uVar7 != uVar15);
                                                  uVar7 = raw._0_8_ & 0xffffffff;
                                                  puVar23 = puVar23 + uVar15;
                                                }
                                                uVar16 = uVar16 - uVar7;
                                              } while (uVar16 != 0);
                                            }
                                            if ((raw._is_shared == false) &&
                                               (raw._data != (bool *)0x0)) {
                                              operator_delete__(raw._data);
                                            }
                                          }
                                          uVar22 = uVar22 + 1;
                                        } while (uVar22 < N);
                                      }
                                      goto LAB_0013b3e8;
                                    }
                                  }
                                  else {
                                    iVar17 = 6;
                                    if (iVar3 < 6) {
                                      iVar17 = iVar3;
                                    }
                                    lVar10 = 0;
                                    do {
                                      cVar1 = "ushort"[lVar10];
                                      cVar18 = cVar1 + ' ';
                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                        cVar18 = cVar1;
                                      }
                                      cVar1 = pcVar20[lVar10];
                                      cVar19 = cVar1 + ' ';
                                      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                        cVar19 = cVar1;
                                      }
                                      if (cVar18 != cVar19) goto LAB_0013c179;
                                      lVar10 = lVar10 + 1;
                                    } while (iVar17 + 1 != (int)lVar10);
                                  }
                                }
                                if (N != 0) {
                                  uVar22 = 0;
                                  do {
                                    iVar2 = fgetc(__stream);
                                    if (iVar2 < 0 || iVar2 == 10) {
                                      uVar16 = 0;
                                    }
                                    else {
                                      uVar7 = 0;
                                      do {
                                        uVar16 = uVar7 + 1;
                                        tmp._data[uVar7] = (char)iVar2;
                                        iVar2 = fgetc(__stream);
                                        if ((iVar2 == 10) || (iVar2 < 0)) break;
                                        bVar24 = uVar7 < 0xfe;
                                        uVar7 = uVar16;
                                      } while (bVar24);
                                    }
                                    tmp._data[uVar16] = '\0';
                                    C = 0;
                                    D = 0;
                                    H = 0;
                                    W = 0;
                                    csiz = 0;
                                    iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C
                                                            ,&csiz);
                                    if (iVar2 < 4) {
                                      pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                      pcVar20 = "(FILE*)";
                                      if (filename != (char *)0x0) {
                                        pcVar20 = filename;
                                      }
                                      CImgIOException::CImgIOException
                                                (pCVar9,
                                                 "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                                 ,(ulong)this->_width,(ulong)this->_allocated_width,
                                                 this->_data,"unsigned char",(ulong)W,(ulong)H,
                                                 (ulong)D,(ulong)C,uVar22,pcVar20);
                                      __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                  CImgException::~CImgException);
                                    }
                                    if (D * C * H * W != 0) {
                                      raw._data = (bool *)0x0;
                                      raw._width = 0;
                                      raw._height = 0;
                                      raw._depth = 0;
                                      raw._spectrum = 0;
                                      raw._is_shared = false;
                                      if (iVar2 == 5) {
                                        pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                        pcVar20 = "(FILE*)";
                                        if (filename != (char *)0x0) {
                                          pcVar20 = filename;
                                        }
                                        CImgIOException::CImgIOException
                                                  (pCVar9,
                                                  "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                  ,(ulong)this->_width,(ulong)this->_allocated_width
                                                  ,this->_data,"unsigned char",pcVar20);
                                        __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                                    CImgException::~CImgException);
                                      }
                                      pCVar14 = this->_data + uVar22;
                                      CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                      uVar16 = (ulong)pCVar14->_spectrum * (ulong)pCVar14->_depth *
                                               (ulong)pCVar14->_height * (ulong)pCVar14->_width;
                                      if (uVar16 != 0) {
                                        puVar23 = pCVar14->_data;
                                        do {
                                          uVar7 = 0x1800000;
                                          if (uVar16 < 0x1800000) {
                                            uVar7 = uVar16;
                                          }
                                          CImg<unsigned_short>::assign
                                                    ((CImg<unsigned_short> *)&raw,(uint)uVar7,1,1,1)
                                          ;
                                          cimg::fread<unsigned_short>
                                                    ((unsigned_short *)raw._data,
                                                     raw._0_8_ & 0xffffffff,(FILE *)__stream);
                                          uVar7 = raw._0_8_ & 0xffffffff;
                                          if ((bVar25) &&
                                             (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                       (raw._8_8_ & 0xffffffff) *
                                                       ((ulong)raw._0_8_ >> 0x20) * uVar7,
                                             0 < lVar10)) {
                                            pbVar12 = raw._data + lVar10 * 2;
                                            do {
                                              pbVar11 = pbVar12 + -2;
                                              *(ushort *)pbVar11 =
                                                   *(ushort *)pbVar11 << 8 | *(ushort *)pbVar11 >> 8
                                              ;
                                              pbVar12 = pbVar12 + -2;
                                            } while (raw._data < pbVar12);
                                          }
                                          if (uVar7 == 0) {
                                            uVar7 = 0;
                                          }
                                          else {
                                            uVar15 = 0;
                                            do {
                                              puVar23[uVar15] = raw._data[uVar15 * 2];
                                              uVar15 = uVar15 + 1;
                                            } while (uVar7 != uVar15);
                                            uVar7 = raw._0_8_ & 0xffffffff;
                                            puVar23 = puVar23 + uVar15;
                                          }
                                          uVar16 = uVar16 - uVar7;
                                        } while (uVar16 != 0);
                                      }
                                      if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
                                        operator_delete__(raw._data);
                                      }
                                    }
                                    uVar22 = uVar22 + 1;
                                  } while (uVar22 < N);
                                }
                                goto LAB_0013b3e8;
                              }
                            }
                            else {
                              iVar17 = 0xe;
                              if (iVar3 < 0xe) {
                                iVar17 = iVar3;
                              }
                              lVar10 = 0;
                              do {
                                cVar1 = "unsigned_short"[lVar10];
                                cVar18 = cVar1 + ' ';
                                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                  cVar18 = cVar1;
                                }
                                cVar1 = pcVar20[lVar10];
                                cVar19 = cVar1 + ' ';
                                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                                  cVar19 = cVar1;
                                }
                                if (cVar18 != cVar19) goto LAB_0013be67;
                                lVar10 = lVar10 + 1;
                              } while (iVar17 + 1 != (int)lVar10);
                            }
                          }
                          if (N != 0) {
                            uVar22 = 0;
                            do {
                              iVar2 = fgetc(__stream);
                              if (iVar2 < 0 || iVar2 == 10) {
                                uVar16 = 0;
                              }
                              else {
                                uVar7 = 0;
                                do {
                                  uVar16 = uVar7 + 1;
                                  tmp._data[uVar7] = (char)iVar2;
                                  iVar2 = fgetc(__stream);
                                  if ((iVar2 == 10) || (iVar2 < 0)) break;
                                  bVar24 = uVar7 < 0xfe;
                                  uVar7 = uVar16;
                                } while (bVar24);
                              }
                              tmp._data[uVar16] = '\0';
                              C = 0;
                              D = 0;
                              H = 0;
                              W = 0;
                              csiz = 0;
                              iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz
                                                     );
                              if (iVar2 < 4) {
                                pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                pcVar20 = "(FILE*)";
                                if (filename != (char *)0x0) {
                                  pcVar20 = filename;
                                }
                                CImgIOException::CImgIOException
                                          (pCVar9,
                                           "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                           ,(ulong)this->_width,(ulong)this->_allocated_width,
                                           this->_data,"unsigned char",(ulong)W,(ulong)H,(ulong)D,
                                           (ulong)C,uVar22,pcVar20);
                                __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                            CImgException::~CImgException);
                              }
                              if (D * C * H * W != 0) {
                                raw._data = (bool *)0x0;
                                raw._width = 0;
                                raw._height = 0;
                                raw._depth = 0;
                                raw._spectrum = 0;
                                raw._is_shared = false;
                                if (iVar2 == 5) {
                                  pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                  pcVar20 = "(FILE*)";
                                  if (filename != (char *)0x0) {
                                    pcVar20 = filename;
                                  }
                                  CImgIOException::CImgIOException
                                            (pCVar9,
                                             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                             ,(ulong)this->_width,(ulong)this->_allocated_width,
                                             this->_data,"unsigned char",pcVar20);
                                  __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                              CImgException::~CImgException);
                                }
                                pCVar14 = this->_data + uVar22;
                                CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                                uVar16 = (ulong)pCVar14->_spectrum * (ulong)pCVar14->_depth *
                                         (ulong)pCVar14->_height * (ulong)pCVar14->_width;
                                if (uVar16 != 0) {
                                  puVar23 = pCVar14->_data;
                                  do {
                                    uVar7 = 0x1800000;
                                    if (uVar16 < 0x1800000) {
                                      uVar7 = uVar16;
                                    }
                                    CImg<unsigned_short>::assign
                                              ((CImg<unsigned_short> *)&raw,(uint)uVar7,1,1,1);
                                    cimg::fread<unsigned_short>
                                              ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,
                                               (FILE *)__stream);
                                    uVar7 = raw._0_8_ & 0xffffffff;
                                    if ((bVar25) &&
                                       (lVar10 = ((ulong)raw._8_8_ >> 0x20) *
                                                 (raw._8_8_ & 0xffffffff) *
                                                 ((ulong)raw._0_8_ >> 0x20) * uVar7, 0 < lVar10)) {
                                      pbVar12 = raw._data + lVar10 * 2;
                                      do {
                                        pbVar11 = pbVar12 + -2;
                                        *(ushort *)pbVar11 =
                                             *(ushort *)pbVar11 << 8 | *(ushort *)pbVar11 >> 8;
                                        pbVar12 = pbVar12 + -2;
                                      } while (raw._data < pbVar12);
                                    }
                                    if (uVar7 == 0) {
                                      uVar7 = 0;
                                    }
                                    else {
                                      uVar15 = 0;
                                      do {
                                        puVar23[uVar15] = raw._data[uVar15 * 2];
                                        uVar15 = uVar15 + 1;
                                      } while (uVar7 != uVar15);
                                      uVar7 = raw._0_8_ & 0xffffffff;
                                      puVar23 = puVar23 + uVar15;
                                    }
                                    uVar16 = uVar16 - uVar7;
                                  } while (uVar16 != 0);
                                }
                                if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
                                  operator_delete__(raw._data);
                                }
                              }
                              uVar22 = uVar22 + 1;
                            } while (uVar22 < N);
                          }
                          goto LAB_0013b3e8;
                        }
                      }
                      else {
                        iVar17 = 4;
                        if (iVar3 < 4) {
                          iVar17 = iVar3;
                        }
                        lVar10 = 0;
                        do {
                          cVar1 = "unsigned char"[lVar10 + 9];
                          cVar18 = cVar1 + ' ';
                          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                            cVar18 = cVar1;
                          }
                          cVar1 = pcVar20[lVar10];
                          cVar19 = cVar1 + ' ';
                          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                            cVar19 = cVar1;
                          }
                          if (cVar18 != cVar19) goto LAB_0013bb10;
                          lVar10 = lVar10 + 1;
                        } while (iVar17 + 1 != (int)lVar10);
                      }
                    }
                    if (N != 0) {
                      uVar22 = 0;
                      do {
                        iVar2 = fgetc(__stream);
                        if (iVar2 < 0 || iVar2 == 10) {
                          uVar16 = 0;
                        }
                        else {
                          uVar7 = 0;
                          do {
                            uVar16 = uVar7 + 1;
                            tmp._data[uVar7] = (char)iVar2;
                            iVar2 = fgetc(__stream);
                            if ((iVar2 == 10) || (iVar2 < 0)) break;
                            bVar25 = uVar7 < 0xfe;
                            uVar7 = uVar16;
                          } while (bVar25);
                        }
                        tmp._data[uVar16] = '\0';
                        C = 0;
                        D = 0;
                        H = 0;
                        W = 0;
                        csiz = 0;
                        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                        if (iVar2 < 4) {
                          pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                          pcVar20 = "(FILE*)";
                          if (filename != (char *)0x0) {
                            pcVar20 = filename;
                          }
                          CImgIOException::CImgIOException
                                    (pCVar9,
                                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                     "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar22,
                                     pcVar20);
                          __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                      CImgException::~CImgException);
                        }
                        if (D * C * H * W != 0) {
                          raw._data = (bool *)0x0;
                          raw._width = 0;
                          raw._height = 0;
                          raw._depth = 0;
                          raw._spectrum = 0;
                          raw._is_shared = false;
                          if (iVar2 == 5) {
                            pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                            pcVar20 = "(FILE*)";
                            if (filename != (char *)0x0) {
                              pcVar20 = filename;
                            }
                            CImgIOException::CImgIOException
                                      (pCVar9,
                                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                       ,(ulong)this->_width,(ulong)this->_allocated_width,
                                       this->_data,"unsigned char",pcVar20);
                            __cxa_throw(pCVar9,&CImgIOException::typeinfo,
                                        CImgException::~CImgException);
                          }
                          pCVar14 = this->_data + uVar22;
                          CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                          uVar16 = (ulong)pCVar14->_spectrum * (ulong)pCVar14->_depth *
                                   (ulong)pCVar14->_height * (ulong)pCVar14->_width;
                          if (uVar16 != 0) {
                            puVar23 = pCVar14->_data;
                            do {
                              uVar7 = 0x1800000;
                              if (uVar16 < 0x1800000) {
                                uVar7 = uVar16;
                              }
                              CImg<char>::assign((CImg<char> *)&raw,(uint)uVar7,1,1,1);
                              pbVar12 = raw._data;
                              uVar4 = raw._width;
                              uVar7 = raw._0_8_ & 0xffffffff;
                              if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                                pCVar8 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                                pcVar20 = "";
                                if (1 < uVar4) {
                                  pcVar20 = "s";
                                }
                                CImgArgumentException::CImgArgumentException
                                          (pCVar8,
                                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                                           ,uVar7,"char",pcVar20,__stream,pbVar12);
                                __cxa_throw(pCVar8,&CImgArgumentException::typeinfo,
                                            CImgException::~CImgException);
                              }
                              if (uVar7 != 0) {
                                lVar10 = 0;
                                uVar15 = uVar7;
                                do {
                                  sVar5 = 0x3f00000;
                                  if (uVar15 < 0x3f00000) {
                                    sVar5 = uVar15;
                                  }
                                  sVar6 = fread(pbVar12 + lVar10,1,sVar5,__stream);
                                  lVar10 = lVar10 + sVar6;
                                  uVar15 = uVar15 - sVar6;
                                } while ((sVar5 == sVar6) && (uVar15 != 0));
                                if (uVar15 != 0) {
                                  cimg::warn("cimg::fread(): Only %u/%u elements could be read from file."
                                             ,lVar10,uVar7);
                                }
                              }
                              if ((raw._0_8_ & 0xffffffff) == 0) {
                                uVar7 = 0;
                              }
                              else {
                                uVar15 = 0;
                                do {
                                  puVar23[uVar15] = raw._data[uVar15];
                                  uVar15 = uVar15 + 1;
                                } while ((raw._0_8_ & 0xffffffff) != uVar15);
                                uVar7 = raw._0_8_ & 0xffffffff;
                                puVar23 = puVar23 + uVar15;
                              }
                              uVar16 = uVar16 - uVar7;
                            } while (uVar16 != 0);
                          }
                          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
                            operator_delete__(raw._data);
                          }
                        }
                        uVar22 = uVar22 + 1;
                      } while (uVar22 < N);
                    }
                    goto LAB_0013b3e8;
                  }
                }
                else {
                  iVar17 = 5;
                  if (iVar3 < 5) {
                    iVar17 = iVar3;
                  }
                  lVar10 = 0;
                  do {
                    cVar1 = "uchar"[lVar10];
                    cVar18 = cVar1 + ' ';
                    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                      cVar18 = cVar1;
                    }
                    cVar1 = pcVar20[lVar10];
                    cVar19 = cVar1 + ' ';
                    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                      cVar19 = cVar1;
                    }
                    if (cVar18 != cVar19) goto LAB_0013b823;
                    lVar10 = lVar10 + 1;
                  } while (iVar17 + 1 != (int)lVar10);
                }
              }
              if (N != 0) {
                uVar22 = 0;
                do {
                  iVar2 = fgetc(__stream);
                  if (iVar2 < 0 || iVar2 == 10) {
                    uVar16 = 0;
                  }
                  else {
                    uVar7 = 0;
                    do {
                      uVar16 = uVar7 + 1;
                      tmp._data[uVar7] = (char)iVar2;
                      iVar2 = fgetc(__stream);
                      if ((iVar2 == 10) || (iVar2 < 0)) break;
                      bVar25 = uVar7 < 0xfe;
                      uVar7 = uVar16;
                    } while (bVar25);
                  }
                  tmp._data[uVar16] = '\0';
                  C = 0;
                  D = 0;
                  H = 0;
                  W = 0;
                  csiz = 0;
                  iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                  if (iVar2 < 4) {
                    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                    pcVar20 = "(FILE*)";
                    if (filename != (char *)0x0) {
                      pcVar20 = filename;
                    }
                    CImgIOException::CImgIOException
                              (pCVar9,
                               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                               "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar22,pcVar20);
                    __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
                  }
                  if (D * C * H * W != 0) {
                    raw._data = (bool *)0x0;
                    raw._width = 0;
                    raw._height = 0;
                    raw._depth = 0;
                    raw._spectrum = 0;
                    raw._is_shared = false;
                    if (iVar2 == 5) {
                      pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                      pcVar20 = "(FILE*)";
                      if (filename != (char *)0x0) {
                        pcVar20 = filename;
                      }
                      CImgIOException::CImgIOException
                                (pCVar9,
                                 "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                 ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                 "unsigned char",pcVar20);
                      __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
                    }
                    pCVar14 = this->_data + uVar22;
                    CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
                    uVar16 = (ulong)pCVar14->_spectrum * (ulong)pCVar14->_depth *
                             (ulong)pCVar14->_height * (ulong)pCVar14->_width;
                    if (uVar16 != 0) {
                      puVar23 = pCVar14->_data;
                      do {
                        uVar7 = 0x1800000;
                        if (uVar16 < 0x1800000) {
                          uVar7 = uVar16;
                        }
                        CImg<unsigned_char>::assign((CImg<unsigned_char> *)&raw,(uint)uVar7,1,1,1);
                        pbVar12 = raw._data;
                        uVar4 = raw._width;
                        uVar7 = raw._0_8_ & 0xffffffff;
                        if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                          pCVar8 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                          pcVar20 = "";
                          if (1 < uVar4) {
                            pcVar20 = "s";
                          }
                          CImgArgumentException::CImgArgumentException
                                    (pCVar8,
                                     "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                                     ,uVar7,"unsigned char",pcVar20,__stream,pbVar12);
                          __cxa_throw(pCVar8,&CImgArgumentException::typeinfo,
                                      CImgException::~CImgException);
                        }
                        if (uVar7 != 0) {
                          lVar10 = 0;
                          uVar15 = uVar7;
                          do {
                            sVar5 = 0x3f00000;
                            if (uVar15 < 0x3f00000) {
                              sVar5 = uVar15;
                            }
                            sVar6 = fread(pbVar12 + lVar10,1,sVar5,__stream);
                            lVar10 = lVar10 + sVar6;
                            uVar15 = uVar15 - sVar6;
                          } while ((sVar5 == sVar6) && (uVar15 != 0));
                          if (uVar15 != 0) {
                            cimg::warn("cimg::fread(): Only %u/%u elements could be read from file."
                                       ,lVar10,uVar7);
                          }
                        }
                        if ((raw._0_8_ & 0xffffffff) == 0) {
                          uVar7 = 0;
                        }
                        else {
                          uVar15 = 0;
                          do {
                            puVar23[uVar15] = raw._data[uVar15];
                            uVar15 = uVar15 + 1;
                          } while ((raw._0_8_ & 0xffffffff) != uVar15);
                          uVar7 = raw._0_8_ & 0xffffffff;
                          puVar23 = puVar23 + uVar15;
                        }
                        uVar16 = uVar16 - uVar7;
                      } while (uVar16 != 0);
                    }
                    if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
                      operator_delete__(raw._data);
                    }
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 < N);
              }
              goto LAB_0013b3e8;
            }
          }
          else {
            iVar17 = 0xd;
            if (iVar3 < 0xd) {
              iVar17 = iVar3;
            }
            lVar10 = 0;
            do {
              cVar1 = "unsigned_char"[lVar10];
              cVar18 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar18 = cVar1;
              }
              cVar1 = pcVar20[lVar10];
              cVar19 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar19 = cVar1;
              }
              if (cVar18 != cVar19) goto LAB_0013b535;
              lVar10 = lVar10 + 1;
            } while (iVar17 + 1 != (int)lVar10);
          }
        }
        if (N != 0) {
          uVar22 = 0;
          do {
            iVar2 = fgetc(__stream);
            if (iVar2 < 0 || iVar2 == 10) {
              uVar16 = 0;
            }
            else {
              uVar7 = 0;
              do {
                uVar16 = uVar7 + 1;
                tmp._data[uVar7] = (char)iVar2;
                iVar2 = fgetc(__stream);
                if ((iVar2 == 10) || (iVar2 < 0)) break;
                bVar25 = uVar7 < 0xfe;
                uVar7 = uVar16;
              } while (bVar25);
            }
            tmp._data[uVar16] = '\0';
            C = 0;
            D = 0;
            H = 0;
            W = 0;
            csiz = 0;
            iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
            if (iVar2 < 4) {
              pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
              pcVar20 = "(FILE*)";
              if (filename != (char *)0x0) {
                pcVar20 = filename;
              }
              CImgIOException::CImgIOException
                        (pCVar9,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                         ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                         "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar22,pcVar20);
              __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
            }
            if (D * C * H * W != 0) {
              raw._data = (bool *)0x0;
              raw._width = 0;
              raw._height = 0;
              raw._depth = 0;
              raw._spectrum = 0;
              raw._is_shared = false;
              if (iVar2 == 5) {
                pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
                pcVar20 = "(FILE*)";
                if (filename != (char *)0x0) {
                  pcVar20 = filename;
                }
                CImgIOException::CImgIOException
                          (pCVar9,
                           "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                           ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                           "unsigned char",pcVar20);
                __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
              }
              pCVar14 = this->_data + uVar22;
              CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
              uVar16 = (ulong)pCVar14->_spectrum * (ulong)pCVar14->_depth *
                       (ulong)pCVar14->_height * (ulong)pCVar14->_width;
              if (uVar16 != 0) {
                puVar23 = pCVar14->_data;
                do {
                  uVar7 = 0x1800000;
                  if (uVar16 < 0x1800000) {
                    uVar7 = uVar16;
                  }
                  CImg<unsigned_char>::assign((CImg<unsigned_char> *)&raw,(uint)uVar7,1,1,1);
                  pbVar12 = raw._data;
                  uVar4 = raw._width;
                  uVar7 = raw._0_8_ & 0xffffffff;
                  if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                    pCVar8 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                    pcVar20 = "";
                    if (1 < uVar4) {
                      pcVar20 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar8,
                               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,uVar7,"unsigned char",pcVar20,__stream,pbVar12);
                    __cxa_throw(pCVar8,&CImgArgumentException::typeinfo,
                                CImgException::~CImgException);
                  }
                  if (uVar7 != 0) {
                    lVar10 = 0;
                    uVar15 = uVar7;
                    do {
                      sVar5 = 0x3f00000;
                      if (uVar15 < 0x3f00000) {
                        sVar5 = uVar15;
                      }
                      sVar6 = fread(pbVar12 + lVar10,1,sVar5,__stream);
                      lVar10 = lVar10 + sVar6;
                      uVar15 = uVar15 - sVar6;
                    } while ((sVar5 == sVar6) && (uVar15 != 0));
                    if (uVar15 != 0) {
                      cimg::warn("cimg::fread(): Only %u/%u elements could be read from file.",
                                 lVar10,uVar7);
                    }
                  }
                  if ((raw._0_8_ & 0xffffffff) == 0) {
                    uVar7 = 0;
                  }
                  else {
                    uVar15 = 0;
                    do {
                      puVar23[uVar15] = raw._data[uVar15];
                      uVar15 = uVar15 + 1;
                    } while ((raw._0_8_ & 0xffffffff) != uVar15);
                    uVar7 = raw._0_8_ & 0xffffffff;
                    puVar23 = puVar23 + uVar15;
                  }
                  uVar16 = uVar16 - uVar7;
                } while (uVar16 != 0);
              }
              if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
                operator_delete__(raw._data);
              }
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < N);
        }
        goto LAB_0013b3e8;
      }
    }
    else {
      iVar17 = 4;
      if (iVar3 < 4) {
        iVar17 = iVar3;
      }
      lVar10 = 0;
      do {
        cVar1 = "bool"[lVar10];
        cVar18 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar18 = cVar1;
        }
        cVar1 = pcVar20[lVar10];
        cVar19 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar19 = cVar1;
        }
        if (cVar18 != cVar19) goto LAB_0013b179;
        lVar10 = lVar10 + 1;
      } while (iVar17 + 1 != (int)lVar10);
    }
  }
  if (N != 0) {
    uVar22 = 0;
    do {
      iVar2 = fgetc(__stream);
      if (iVar2 < 0 || iVar2 == 10) {
        uVar16 = 0;
      }
      else {
        uVar7 = 0;
        do {
          uVar16 = uVar7 + 1;
          tmp._data[uVar7] = (char)iVar2;
          iVar2 = fgetc(__stream);
          if ((iVar2 == 10) || (iVar2 < 0)) break;
          bVar25 = uVar7 < 0xfe;
          uVar7 = uVar16;
        } while (bVar25);
      }
      tmp._data[uVar16] = '\0';
      C = 0;
      D = 0;
      H = 0;
      W = 0;
      csiz = 0;
      iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
      if (iVar2 < 4) {
        pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
        pcVar20 = "(FILE*)";
        if (filename != (char *)0x0) {
          pcVar20 = filename;
        }
        CImgIOException::CImgIOException
                  (pCVar9,
                   "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                   ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                   (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar22,pcVar20);
        __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
      }
      if (D * C * H * W != 0) {
        raw._data = (bool *)0x0;
        raw._width = 0;
        raw._height = 0;
        raw._depth = 0;
        raw._spectrum = 0;
        raw._is_shared = false;
        if (iVar2 == 5) {
          pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar20 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar20 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar9,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     pcVar20);
          __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        pCVar14 = this->_data + uVar22;
        CImg<unsigned_char>::assign(pCVar14,W,H,D,C);
        uVar16 = (ulong)pCVar14->_spectrum * (ulong)pCVar14->_depth *
                 (ulong)pCVar14->_height * (ulong)pCVar14->_width;
        if (uVar16 != 0) {
          puVar23 = pCVar14->_data;
          do {
            uVar7 = 0x1800000;
            if (uVar16 < 0x1800000) {
              uVar7 = uVar16;
            }
            CImg<bool>::assign(&raw,(uint)uVar7,1,1,1);
            pbVar12 = raw._data;
            uVar4 = raw._width;
            uVar7 = raw._0_8_ & 0xffffffff;
            if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
              pCVar8 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar20 = "";
              if (1 < uVar4) {
                pcVar20 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (pCVar8,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,uVar7,"bool",pcVar20,__stream,pbVar12);
              __cxa_throw(pCVar8,&CImgArgumentException::typeinfo,CImgException::~CImgException);
            }
            if (uVar7 != 0) {
              lVar10 = 0;
              uVar15 = uVar7;
              do {
                sVar5 = 0x3f00000;
                if (uVar15 < 0x3f00000) {
                  sVar5 = uVar15;
                }
                sVar6 = fread(pbVar12 + lVar10,1,sVar5,__stream);
                lVar10 = lVar10 + sVar6;
                uVar15 = uVar15 - sVar6;
              } while ((sVar5 == sVar6) && (uVar15 != 0));
              if (uVar15 != 0) {
                cimg::warn("cimg::fread(): Only %u/%u elements could be read from file.",lVar10,
                           uVar7);
              }
            }
            if ((raw._0_8_ & 0xffffffff) == 0) {
              uVar7 = 0;
            }
            else {
              uVar15 = 0;
              do {
                puVar23[uVar15] = raw._data[uVar15];
                uVar15 = uVar15 + 1;
              } while ((raw._0_8_ & 0xffffffff) != uVar15);
              uVar7 = raw._0_8_ & 0xffffffff;
              puVar23 = puVar23 + uVar15;
            }
            uVar16 = uVar16 - uVar7;
          } while (uVar16 != 0);
        }
        if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
          operator_delete__(raw._data);
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < N);
  }
LAB_0013b3e8:
  if (file == (FILE *)0x0) {
    if (__stream == (FILE *)0x0) {
      cimg::warn("cimg::fclose(): Specified file is (null).");
    }
    else if (((_stdin != __stream) && (_stdout != __stream)) &&
            (uVar4 = fclose(__stream), uVar4 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar4);
    }
  }
  if ((str_endian._is_shared == false) && (str_endian._data != (char *)0x0)) {
    operator_delete__(str_endian._data);
  }
  if ((str_pixeltype._is_shared == false) && (str_pixeltype._data != (char *)0x0)) {
    operator_delete__(str_pixeltype._data);
  }
  if ((tmp._is_shared == false) && (tmp._data != (char *)0x0)) {
    operator_delete__(tmp._data);
  }
  return this;
}

Assistant:

CImgList<T>& _load_cimg(std::FILE *const file, const char *const filename) {
#ifdef cimg_use_zlib
#define _cimgz_load_cimg_case(Tss) { \
   Bytef *const cbuf = new Bytef[csiz]; \
   cimg::fread(cbuf,csiz,nfile); \
   raw.assign(W,H,D,C); \
   unsigned long destlen = (unsigned long)raw.size()*sizeof(Tss); \
   uncompress((Bytef*)raw._data,&destlen,cbuf,csiz); \
   delete[] cbuf; \
   if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
   raw.move_to(img); \
}
#else
#define _cimgz_load_cimg_case(Tss) \
   throw CImgIOException(_cimglist_instance \
                         "load_cimg(): Unable to load compressed data from file '%s' unless zlib is enabled.", \
                         cimglist_instance, \
                         filename?filename:"(FILE*)");
#endif

#define _cimg_load_cimg_case(Ts,Tss) \
      if (!loaded && !cimg::strcasecmp(Ts,str_pixeltype)) { \
        for (unsigned int l = 0; l<N; ++l) { \
          j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0; \
          W = H = D = C = 0; csiz = 0; \
          if ((err = cimg_sscanf(tmp,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz))<4) \
            throw CImgIOException(_cimglist_instance \
                                  "load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file '%s'.", \
                                  cimglist_instance, \
                                  W,H,D,C,l,filename?filename:("(FILE*)")); \
          if (W*H*D*C>0) { \
            CImg<Tss> raw; \
            CImg<T> &img = _data[l]; \
            if (err==5) _cimgz_load_cimg_case(Tss) \
            else { \
              img.assign(W,H,D,C); \
              T *ptrd = img._data; \
              for (unsigned long to_read = img.size(); to_read; ) { \
                raw.assign(cimg::min(to_read,cimg_iobuffer)); \
                cimg::fread(raw._data,raw._width,nfile); \
                if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
                const Tss *ptrs = raw._data; \
                for (unsigned long off = (unsigned long)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++); \
                to_read-=raw._width; \
              } \
            } \
          } \
        } \
        loaded = true; \
      }

      if (!filename && !file)
        throw CImgArgumentException(_cimglist_instance
                                    "load_cimg(): Specified filename is (null).",
                                    cimglist_instance);

      const unsigned long cimg_iobuffer = 24*1024*1024;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      bool loaded = false, endian = cimg::endianness();
      CImg<charT> tmp(256), str_pixeltype(256), str_endian(256);
      *tmp = *str_pixeltype = *str_endian = 0;
      unsigned int j, N = 0, W, H, D, C;
      unsigned long csiz;
      int i, err;
      do {
        j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0;
      } while (*tmp=='#' && i>=0);
      err = cimg_sscanf(tmp,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",
                        &N,str_pixeltype._data,str_endian._data);
      if (err<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): CImg header not found in file '%s'.",
                              cimglist_instance,
                              filename?filename:"(FILE*)");
      }
      if (!cimg::strncasecmp("little",str_endian,6)) endian = false;
      else if (!cimg::strncasecmp("big",str_endian,3)) endian = true;
      assign(N);
      _cimg_load_cimg_case("bool",bool);
      _cimg_load_cimg_case("unsigned_char",unsigned char);
      _cimg_load_cimg_case("uchar",unsigned char);
      _cimg_load_cimg_case("char",char);
      _cimg_load_cimg_case("unsigned_short",unsigned short);
      _cimg_load_cimg_case("ushort",unsigned short);
      _cimg_load_cimg_case("short",short);
      _cimg_load_cimg_case("unsigned_int",unsigned int);
      _cimg_load_cimg_case("uint",unsigned int);
      _cimg_load_cimg_case("int",int);
      _cimg_load_cimg_case("unsigned_long",unsigned long);
      _cimg_load_cimg_case("ulong",unsigned long);
      _cimg_load_cimg_case("long",long);
      _cimg_load_cimg_case("float",float);
      _cimg_load_cimg_case("double",double);

      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): Unsupported pixel type '%s' for file '%s'.",
                              cimglist_instance,
                              str_pixeltype._data,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }